

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double circular_normal_pdf(double *x,double *a,double b)

{
  __type _Var1;
  __type _Var2;
  __type _Var3;
  double dVar4;
  double r8_pi;
  double pdf;
  double d;
  double b_local;
  double *a_local;
  double *x_local;
  
  _Var1 = std::pow<double,int>(*x - *a,2);
  _Var2 = std::pow<double,int>(x[1] - a[1],2);
  _Var3 = std::pow<double,int>(b,2);
  dVar4 = exp(((_Var1 + _Var2) / _Var3) * -0.5);
  return dVar4 / (b * 2.0 * b * 3.141592653589793);
}

Assistant:

double circular_normal_pdf ( double x[2], double a[2], double b )

//****************************************************************************80
//
//  Purpose:
//
//    CIRCULAR_NORMAL_PDF evaluates the Circular Normal PDF.
//
//  Discussion:
//
//    PDF(X) = EXP ( - 0.5D+00 * ( ( (X(1)-A(1))^2 + (X(2)-A(2))^2 ) / B^2 ) 
//      / ( 2 * PI * B^2 )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    03 January 2011
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X[2], the argument of the PDF.
//
//    Input, double A[2], a parameter of the PDF, the mean value.
//
//    Input, double B, a parameter of the PDF, the standard deviation.
//
//    Output, double CIRCULAR_NORMAL_PDF, the value of the PDF.
//
{
  double d;
  double pdf;
  const double r8_pi = 3.14159265358979323;

  d = ( pow ( x[0] - a[0], 2 ) 
      + pow ( x[1] - a[1], 2 ) ) / pow ( b, 2 );

  pdf = exp ( - 0.5 * d ) / ( 2.0 * b * b * r8_pi );

  return pdf;
}